

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_NoParent_Test::TestBody
          (DiskSourceTreeTest_NoParent_Test *this)

{
  reference pvVar1;
  AlphaNum *in_RCX;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  AlphaNum local_240;
  AlphaNum local_210;
  string local_1e0;
  string_view local_1c0;
  string_view local_1b0;
  AlphaNum local_1a0;
  AlphaNum local_170;
  string local_140;
  AlphaNum local_120;
  AlphaNum local_f0;
  string local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  string local_30;
  DiskSourceTreeTest_NoParent_Test *local_10;
  DiskSourceTreeTest_NoParent_Test *this_local;
  
  local_10 = this;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,pvVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,"/foo");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_30,(lts_20250127 *)&local_60,&local_90,in_RCX);
  DiskSourceTreeTest::AddFile(&this->super_DiskSourceTreeTest,&local_30,"Hello World!");
  std::__cxx11::string::~string((string *)&local_30);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_f0,pvVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_120,"/bar");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_c0,(lts_20250127 *)&local_f0,&local_120,in_RCX);
  DiskSourceTreeTest::AddSubdir(&this->super_DiskSourceTreeTest,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_170,pvVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1a0,"/bar/baz");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_140,(lts_20250127 *)&local_170,&local_1a0,in_RCX);
  DiskSourceTreeTest::AddFile(&this->super_DiskSourceTreeTest,&local_140,"Blah.");
  std::__cxx11::string::~string((string *)&local_140);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b0,anon_var_dwarf_37cdd0 + 5);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_210,pvVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_240,"/bar");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1e0,(lts_20250127 *)&local_210,&local_240,in_RCX);
  local_1c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e0);
  DiskSourceTree::MapPath(&(this->super_DiskSourceTreeTest).source_tree_,local_1b0,local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"baz",&local_261);
  DiskSourceTreeTest::ExpectFileContents(&this->super_DiskSourceTreeTest,&local_260,"Blah.");
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"../foo",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_2b1);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_288,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"../bar/baz",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_301);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_2d8,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, NoParent) {
  // Test that we cannot open files in a parent of a mapped directory.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddSubdir(absl::StrCat(dirnames_[0], "/bar"));
  AddFile(absl::StrCat(dirnames_[0], "/bar/baz"), "Blah.");
  source_tree_.MapPath("", absl::StrCat(dirnames_[0], "/bar"));

  ExpectFileContents("baz", "Blah.");
  ExpectCannotOpenFile("../foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("../bar/baz",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
}